

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

char * ODDLParser::OpenDDLParser::parseDataArrayList
                 (char *in,char *end,ValueType type,DataArrayList **dataArrayList)

{
  DataArrayList *pDVar1;
  DataArrayList **ppDVar2;
  DataArrayList *pDVar3;
  char *pcVar4;
  size_t numValues;
  size_t numRefs;
  Reference *refs;
  size_t local_50;
  size_t local_48;
  Reference *local_40;
  Value *local_38;
  
  if ((dataArrayList != (DataArrayList **)0x0) &&
     (*dataArrayList = (DataArrayList *)0x0, in != end && in != (char *)0x0)) {
    in = lookForNextToken<char>(in,end);
    if (*in == '{') {
      pcVar4 = in + 1;
      local_40 = (Reference *)0x0;
      pDVar3 = (DataArrayList *)0x0;
      do {
        local_48 = 0;
        local_50 = 0;
        local_38 = (Value *)0x0;
        pcVar4 = parseDataList(pcVar4,end,type,&local_38,&local_50,&local_40,&local_48);
        pDVar1 = pDVar3;
        if (local_38 != (Value *)0x0 || local_48 != 0) {
          pDVar1 = createDataArrayList(local_38,local_50,local_40,local_48);
          ppDVar2 = &pDVar3->m_next;
          if (pDVar3 == (DataArrayList *)0x0) {
            ppDVar2 = dataArrayList;
          }
          *ppDVar2 = pDVar1;
        }
      } while ((pcVar4 != end) && (pDVar3 = pDVar1, *pcVar4 == ','));
      pcVar4 = lookForNextToken<char>(pcVar4,end);
      in = pcVar4 + 1;
    }
  }
  return in;
}

Assistant:

char *OpenDDLParser::parseDataArrayList( char *in, char *end,Value::ValueType type, 
                                         DataArrayList **dataArrayList ) {
    if ( ddl_nullptr == dataArrayList ) {
        return in;
    }

    *dataArrayList = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    if( *in == Grammar::OpenBracketToken[ 0 ] ) {
        ++in;
        Value *currentValue( ddl_nullptr );
        Reference *refs( ddl_nullptr );
        DataArrayList *prev( ddl_nullptr ), *currentDataList( ddl_nullptr );
        do {
            size_t numRefs( 0 ), numValues( 0 );
            currentValue = ddl_nullptr;

            in = parseDataList( in, end, type, &currentValue, numValues, &refs, numRefs );
            if( ddl_nullptr != currentValue || 0 != numRefs ) {
                if( ddl_nullptr == prev ) {
                    *dataArrayList = createDataArrayList( currentValue, numValues, refs, numRefs );
                    prev = *dataArrayList;
                } else {
                    currentDataList = createDataArrayList( currentValue, numValues, refs, numRefs );
                    if( ddl_nullptr != prev ) {
                        prev->m_next = currentDataList;
                        prev = currentDataList;
                    }
                }
            }
        } while( Grammar::CommaSeparator[ 0 ] == *in && in != end );
        in = lookForNextToken( in, end );
        ++in;
    }

    return in;
}